

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::PrimitiveTypeName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Options *options,CppType type)

{
  uint uVar1;
  Options *options_00;
  char *pcVar2;
  char *in_R8;
  string_view type_00;
  _anonymous_namespace_ *p_Stack_20;
  LogMessage LStack_18;
  
  uVar1 = (int)options - 1;
  if (9 < uVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/helpers.cc"
               ,0x341);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&LStack_18,(char (*) [16])"Can\'t get here.");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&LStack_18);
  }
  type_00._M_len =
       (long)&switchD_00af5dd4::switchdataD_00faf7d0 +
       (long)(int)(&switchD_00af5dd4::switchdataD_00faf7d0)[uVar1];
  switch((int)options) {
  case 1:
    options_00 = (Options *)0xe974f2;
    goto LAB_00af5e15;
  case 2:
    options_00 = (Options *)0xe10fc5;
LAB_00af5e15:
    p_Stack_20 = (_anonymous_namespace_ *)&DAT_00000005;
LAB_00af5e17:
    type_00._M_str = in_R8;
    (anonymous_namespace)::IntTypeName_abi_cxx11_
              (__return_storage_ptr__,p_Stack_20,options_00,type_00);
    return __return_storage_ptr__;
  case 3:
    pcVar2 = "map_uint32_uint32";
    goto LAB_00af5e01;
  case 4:
    pcVar2 = "map_uint64_uint64";
LAB_00af5e01:
    options_00 = (Options *)(pcVar2 + 0xb);
    p_Stack_20 = (_anonymous_namespace_ *)&DAT_00000006;
    goto LAB_00af5e17;
  case 5:
    pcVar2 = "double";
    break;
  case 6:
    pcVar2 = "float";
    break;
  case 7:
    pcVar2 = "bool";
    break;
  case 8:
    pcVar2 = "int";
    break;
  case 9:
    pcVar2 = "std::string";
    break;
  case 10:
    pcVar2 = anon_var_dwarf_651463 + 5;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pcVar2,(allocator<char> *)&LStack_18);
  return __return_storage_ptr__;
}

Assistant:

std::string PrimitiveTypeName(const Options& options,
                              FieldDescriptor::CppType type) {
  switch (type) {
    case FieldDescriptor::CPPTYPE_INT32:
      return IntTypeName(options, "int32");
    case FieldDescriptor::CPPTYPE_INT64:
      return IntTypeName(options, "int64");
    case FieldDescriptor::CPPTYPE_UINT32:
      return IntTypeName(options, "uint32");
    case FieldDescriptor::CPPTYPE_UINT64:
      return IntTypeName(options, "uint64");
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return "double";
    case FieldDescriptor::CPPTYPE_FLOAT:
      return "float";
    case FieldDescriptor::CPPTYPE_BOOL:
      return "bool";
    case FieldDescriptor::CPPTYPE_ENUM:
      return "int";
    case FieldDescriptor::CPPTYPE_STRING:
      return "std::string";
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "";

      // No default because we want the compiler to complain if any new
      // CppTypes are added.
  }

  ABSL_LOG(FATAL) << "Can't get here.";
  return "";
}